

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_photogrammetry.h
# Opt level: O0

ON_AerialPhotoCameraPosition * __thiscall
ON_AerialPhotoCameraPosition::operator=
          (ON_AerialPhotoCameraPosition *this,ON_AerialPhotoCameraPosition *param_1)

{
  uchar uVar1;
  uchar uVar2;
  uchar uVar3;
  uint uVar4;
  ON_AerialPhotoCameraPosition *param_1_local;
  ON_AerialPhotoCameraPosition *this_local;
  
  uVar1 = param_1->m_reserved1[0];
  uVar2 = param_1->m_reserved1[1];
  uVar3 = param_1->m_reserved1[2];
  uVar4 = param_1->m_reserved2;
  this->m_status = param_1->m_status;
  this->m_reserved1[0] = uVar1;
  this->m_reserved1[1] = uVar2;
  this->m_reserved1[2] = uVar3;
  this->m_reserved2 = uVar4;
  ON_UnitSystem::operator=(&this->m_unit_system,&param_1->m_unit_system);
  memcpy(&this->m_location,&param_1->m_location,0x110);
  return this;
}

Assistant:

class ON_CLASS ON_AerialPhotoCameraPosition
{
public:
  ON_AerialPhotoCameraPosition();

  /*
  Returns:
    True if both the location and orientation are set.
  */
  bool IsSet() const;

  void Unset();

  /////////////////////////////////////////////////////////
  //
  // Camera position unit system
  //
  bool UnitSystemIsSet() const;
  bool SetUnitSystem( ON::LengthUnitSystem unit_system );
  bool SetUnitSystem ( ON_UnitSystem unit_system );
  ON_UnitSystem UnitSystem() const;
  bool GetUnitSystem( ON_UnitSystem& unit_system ) const;
  void UnsetUnitSystem();


  /////////////////////////////////////////////////////////
  //
  // Location interface
  //
  bool LocationIsSet() const;

  bool SetLocation( 
    ON_3dPoint camera_location 
    );

  bool GetLocation(
    ON_3dPoint& camera_location
    ) const;

  ON_3dPoint Location() const;

  void UnsetLocation();

  /////////////////////////////////////////////////////////
  //
  // Orientation interface
  //
  bool OrientationIsSet() const;    

  bool GetOrientationAnglesDegrees(
    double* omega_degrees, 
    double* phi_degrees, 
    double* kappa_degrees
    ) const;

  bool GetOrientationAnglesRadians(
    double* omega_radians, 
    double* phi_radians, 
    double* kappa_radians
    ) const;

  /*
  Description:
    Get a right handed ortho normal camera frame.
  Parameters:
    camera_X - [out]
      world coordinate unit vector pointing to the right in the camera image
    camera_Y - [out]
      world coordinate unit vector in the camera up direction.
    camera_Z - [out]
      world coordinate unit vector pointing into the camera (from the
      image toward the camera).
  */
  bool GetOrientationFrame(
    ON_3dVector& camera_X,
    ON_3dVector& camera_Y,
    ON_3dVector& camera_Z
    ) const;

  bool GetOrientationUp(
    ON_3dVector& camera_up
    ) const;

  bool GetOrientationRight(
    ON_3dVector& camera_right
    ) const;

  bool GetOrientationDirection(
    ON_3dVector& camera_direction
    ) const;


  /*
  Returns:
    A rotation transformation "R" such that
    camera right = R*ON_3dVector::XAxis
    camera up = R*ON_3dVector::YAxis
    camera direction = -R*ON_3dVector::ZAxis
  */
  bool GetOrientationRotation(
    ON_Xform& camera_rotaion 
    ) const;

  ON_Xform OrientationRotation() const;

  /*
  Description:
    Set camera orientation information from rotation angles
    in radians.

  Remarks:
    There are four ways to specify the camera's orientation.
    1) Use SetOrientationAnglesRadians() to set
       camera orientation information from rotation angles
       in radians.
    2) Use SetOrientationAnglesDegrees() to set
       camera orientation information from rotation angles
       in degrees.
    3) Use SetOrientationVectors() to set 
       camera orientation information from vectors
       that report the camera's up, right and direction.
    3) Use SetOrientationRotation() to set 
       camera orientation information from a rotation
       matrix.
    Use the method for which you have the most accurate input
    and the other values will be calculated as accurately as
    possible.
  */
  bool SetOrientationAnglesRadians(
    double omega_radians, 
    double phi_radians, 
    double kappa_radians
    );

  /*
  Description:
    Set camera orientation information from rotation angles
    in degrees.

  Remarks:
    There are four ways to specify the camera's orientation.
    1) Use SetCameraOrientationAnglesRadians() to set
       camera orientation information from rotation angles
       in radians.
    2) Use SetCameraOrientationAnglesDegrees() to set
       camera orientation information from rotation angles
       in degrees.
    3) Use SetCameraOrientationVectors() to set 
       camera orientation information from vectors
       that report the camera's up, right and direction.
    3) Use SetCameraOrientationRotation() to set 
       camera orientation information from a rotation
       matrix.
    Use the method for which you have the most accurate input
    and the other values will be calculated as accurately as
    possible.
  */
  bool SetOrientationAnglesDegrees(
    double omega_degrees, 
    double phi_degrees, 
    double kappa_degrees
    );

  /*
  Description:
    Set camera orientation information from up, right
    and direction vectors.

  Remarks:
    There are four ways to specify the camera's orientation.
    1) Use SetCameraOrientationAnglesRadians() to set
       camera orientation information from rotation angles
       in radians.
    2) Use SetCameraOrientationAnglesDegrees() to set
       camera orientation information from rotation angles
       in degrees.
    3) Use SetCameraOrientationVectors() to set 
       camera orientation information from vectors
       that report the camera's up, right and direction.
    3) Use SetCameraOrientationRotation() to set 
       camera orientation information from a rotation
       matrix.
    Use the method for which you have the most accurate input
    and the other values will be calculated as accurately as
    possible.
  */
  bool SetOrientationVectors(
    ON_3dVector camera_up,
    ON_3dVector camera_right,
    ON_3dVector camera_direction
    );

  /*
  Description:
    Set camera orientation information from a rotation matrix.

  Remarks:
    There are four ways to specify the camera's orientation.
    1) Use SetCameraOrientationAnglesRadians() to set
       camera orientation information from rotation angles
       in radians.
    2) Use SetCameraOrientationAnglesDegrees() to set
       camera orientation information from rotation angles
       in degrees.
    3) Use SetCameraOrientationVectors() to set 
       camera orientation information from vectors
       that report the camera's up, right and direction.
    3) Use SetCameraOrientationRotation() to set 
       camera orientation information from a rotation
       matrix.
    Use the method for which you have the most accurate input
    and the other values will be calculated as accurately as
    possible.
  */
  bool SetOrientationRotation(
    ON_Xform camera_rotation
    );

  void UnsetOrientation();
  
private:
  unsigned char m_status;
  unsigned char m_reserved1[3];
  unsigned int m_reserved2;

  ON_UnitSystem m_unit_system;

  ON_3dPoint m_location;

  ON_3dVector m_orientation_angles_degrees;
  ON_3dVector m_orientation_angles_radians;

  ON_3dVector m_orientation_direction;
  ON_3dVector m_orientation_up;
  ON_3dVector m_orientation_right;

  ON_Xform m_orientation_rotation;
}